

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O1

void ggml_compute_forward_sin(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  int iVar2;
  int iVar3;
  ggml_type gVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  char cVar14;
  ushort uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong in_RCX;
  char *pcVar20;
  long lVar21;
  long lVar22;
  undefined8 uVar23;
  ggml_tensor *pgVar24;
  ggml_tensor *pgVar25;
  ggml_tensor *pgVar26;
  uint uVar27;
  ulong uVar28;
  long in_R9;
  ulong uVar29;
  int64_t ir;
  long lVar30;
  long lVar31;
  long lVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  anon_union_4_2_947300a4 u;
  float fVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar36 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auStack_300 [64];
  undefined8 uStack_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  ggml_tensor *pgStack_1b0;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  pgVar24 = dst->src[0];
  gVar1 = pgVar24->type;
  if ((gVar1 == GGML_TYPE_F32) && (dst->type == GGML_TYPE_F32)) {
    cVar14 = ggml_is_contiguous_1(pgVar24);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_001300dd;
      if (pgVar24->nb[0] == 4) {
        lVar22 = pgVar24->ne[1];
        lVar19 = pgVar24->ne[2];
        sVar5 = pgVar24->nb[1];
        sVar6 = pgVar24->nb[2];
        sVar7 = pgVar24->nb[3];
        lVar8 = dst->ne[0];
        sVar10 = dst->nb[1];
        sVar11 = dst->nb[2];
        sVar12 = dst->nb[3];
        iVar2 = params->ith;
        iVar3 = params->nth;
        lVar17 = ggml_nrows(pgVar24);
        lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
        lVar30 = iVar2 * lVar18;
        lVar18 = lVar18 + lVar30;
        if (lVar17 <= lVar18) {
          lVar18 = lVar17;
        }
        if (lVar18 <= lVar30) {
          return;
        }
        lVar19 = lVar19 * lVar22;
        do {
          lVar17 = lVar30 / lVar19;
          lVar21 = lVar30 % lVar19;
          lVar32 = lVar21 / lVar22;
          lVar21 = lVar21 % lVar22;
          if (0 < lVar8) {
            pvVar9 = dst->data;
            pvVar13 = pgVar24->data;
            lVar31 = 0;
            do {
              fVar35 = sinf(*(float *)((long)pvVar13 +
                                      lVar31 * 4 + lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7)
                           );
              *(float *)((long)pvVar9 +
                        lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) = fVar35;
              lVar31 = lVar31 + 1;
            } while (lVar8 != lVar31);
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != lVar18);
        return;
      }
LAB_001300f9:
      pcVar20 = "nb00 == sizeof(src0_t)";
      uVar23 = 0x56;
      goto LAB_00130113;
    }
  }
  else if ((gVar1 == GGML_TYPE_F16) && (dst->type == GGML_TYPE_F16)) {
    cVar14 = ggml_is_contiguous_1(pgVar24);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
      if (dst->nb[0] == 2) {
        if (pgVar24->nb[0] == 2) {
          lVar22 = pgVar24->ne[1];
          lVar19 = pgVar24->ne[2];
          sVar5 = pgVar24->nb[1];
          sVar6 = pgVar24->nb[2];
          sVar7 = pgVar24->nb[3];
          lVar8 = dst->ne[0];
          iVar2 = params->ith;
          iVar3 = params->nth;
          lVar17 = ggml_nrows(pgVar24);
          lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
          lVar30 = iVar2 * lVar18;
          lVar18 = lVar18 + lVar30;
          if (lVar17 <= lVar18) {
            lVar18 = lVar17;
          }
          if (lVar18 <= lVar30) {
            return;
          }
          lVar19 = lVar19 * lVar22;
          do {
            lVar17 = lVar30 % lVar19;
            if (0 < lVar8) {
              pvVar9 = pgVar24->data;
              lVar32 = 0;
              do {
                auVar39._0_4_ =
                     sinf(*(float *)(&ggml_table_f32_f16 +
                                    (ulong)*(ushort *)
                                            ((long)pvVar9 +
                                            lVar32 * 2 +
                                            (lVar17 / lVar22) * sVar6 +
                                            (lVar17 % lVar22) * sVar5 + (lVar30 / lVar19) * sVar7) *
                                    4));
                auVar39._4_60_ = extraout_var;
                auVar36 = vcvtps2ph_f16c(auVar39._0_16_,0);
                vpextrw_avx(auVar36,0);
                lVar32 = lVar32 + 1;
              } while (lVar8 != lVar32);
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != lVar18);
          return;
        }
        goto LAB_001300f9;
      }
      goto LAB_001300dd;
    }
  }
  else if (gVar1 == GGML_TYPE_BF16) {
    gVar4 = dst->type;
    in_RCX = (ulong)gVar4;
    if (gVar4 == GGML_TYPE_F32) {
      cVar14 = ggml_is_contiguous_1(pgVar24);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar24->nb[0] == 2) {
            lVar22 = pgVar24->ne[1];
            lVar19 = pgVar24->ne[2];
            sVar5 = pgVar24->nb[1];
            sVar6 = pgVar24->nb[2];
            sVar7 = pgVar24->nb[3];
            lVar8 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar2 = params->ith;
            iVar3 = params->nth;
            lVar17 = ggml_nrows(pgVar24);
            lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
            lVar30 = iVar2 * lVar18;
            lVar18 = lVar18 + lVar30;
            if (lVar17 <= lVar18) {
              lVar18 = lVar17;
            }
            if (lVar18 <= lVar30) {
              return;
            }
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar30 / lVar19;
              lVar21 = lVar30 % lVar19;
              lVar32 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = dst->data;
                pvVar13 = pgVar24->data;
                lVar31 = 0;
                do {
                  fVar35 = sinf((float)((uint)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar31 * 2 +
                                               lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7) <<
                                       0x10));
                  *(float *)((long)pvVar9 +
                            lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                       fVar35;
                  lVar31 = lVar31 + 1;
                } while (lVar8 != lVar31);
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != lVar18);
            return;
          }
          goto LAB_001300f9;
        }
        goto LAB_001300dd;
      }
    }
    else {
      if (gVar4 != GGML_TYPE_BF16) goto LAB_0012fc32;
      cVar14 = ggml_is_contiguous_1(pgVar24);
      if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
         (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
        if (dst->nb[0] == 2) {
          if (pgVar24->nb[0] == 2) {
            lVar22 = pgVar24->ne[1];
            lVar19 = pgVar24->ne[2];
            sVar5 = pgVar24->nb[1];
            sVar6 = pgVar24->nb[2];
            sVar7 = pgVar24->nb[3];
            lVar8 = dst->ne[0];
            sVar10 = dst->nb[1];
            sVar11 = dst->nb[2];
            sVar12 = dst->nb[3];
            iVar2 = params->ith;
            iVar3 = params->nth;
            lVar17 = ggml_nrows(pgVar24);
            lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
            lVar30 = iVar2 * lVar18;
            lVar18 = lVar18 + lVar30;
            if (lVar17 <= lVar18) {
              lVar18 = lVar17;
            }
            if (lVar18 <= lVar30) {
              return;
            }
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar30 / lVar19;
              lVar21 = lVar30 % lVar19;
              lVar32 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = dst->data;
                pvVar13 = pgVar24->data;
                lVar31 = 0;
                do {
                  fVar35 = sinf((float)((uint)*(ushort *)
                                               ((long)pvVar13 +
                                               lVar31 * 2 +
                                               lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7) <<
                                       0x10));
                  if ((uint)ABS(fVar35) < 0x7f800001) {
                    uVar15 = (ushort)((int)fVar35 + 0x7fff + ((uint)fVar35 >> 0x10 & 1) >> 0x10);
                  }
                  else {
                    uVar15 = (ushort)((uint)fVar35 >> 0x10) | 0x40;
                  }
                  *(ushort *)
                   ((long)pvVar9 + lVar31 * 2 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12)
                       = uVar15;
                  lVar31 = lVar31 + 1;
                } while (lVar8 != lVar31);
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != lVar18);
            return;
          }
          goto LAB_001300f9;
        }
        goto LAB_001300dd;
      }
    }
  }
  else {
LAB_0012fc32:
    if ((gVar1 != GGML_TYPE_F16) || (dst->type != GGML_TYPE_F32)) {
      ggml_compute_forward_sin_cold_1();
      pgVar25 = pgVar24->src[0];
      gVar1 = pgVar25->type;
      if ((gVar1 == GGML_TYPE_F32) && (pgVar24->type == GGML_TYPE_F32)) {
        cVar14 = ggml_is_contiguous_1(pgVar25);
        if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar24), cVar14 != '\0')) &&
           (cVar14 = ggml_are_same_shape(pgVar25,pgVar24), cVar14 != '\0')) {
          if (pgVar24->nb[0] != 4) goto LAB_00130969;
          if (pgVar25->nb[0] == 4) {
            lVar22 = pgVar25->ne[1];
            lVar19 = pgVar25->ne[2];
            sVar5 = pgVar25->nb[1];
            sVar6 = pgVar25->nb[2];
            sVar7 = pgVar25->nb[3];
            lVar8 = pgVar24->ne[0];
            sVar10 = pgVar24->nb[1];
            sVar11 = pgVar24->nb[2];
            sVar12 = pgVar24->nb[3];
            gVar1 = dst->type;
            iVar2 = *(int *)&dst->field_0x4;
            lVar17 = ggml_nrows(pgVar25);
            lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
            lVar30 = (int)gVar1 * lVar18;
            lVar18 = lVar18 + lVar30;
            if (lVar17 <= lVar18) {
              lVar18 = lVar17;
            }
            if (lVar18 <= lVar30) {
              return;
            }
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar30 / lVar19;
              lVar21 = lVar30 % lVar19;
              lVar32 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = pgVar24->data;
                pvVar13 = pgVar25->data;
                lVar31 = 0;
                do {
                  fVar35 = cosf(*(float *)((long)pvVar13 +
                                          lVar31 * 4 +
                                          lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7));
                  *(float *)((long)pvVar9 +
                            lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                       fVar35;
                  lVar31 = lVar31 + 1;
                } while (lVar8 != lVar31);
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != lVar18);
            return;
          }
LAB_00130985:
          pcVar20 = "nb00 == sizeof(src0_t)";
          uVar23 = 0x56;
          goto LAB_0013099f;
        }
      }
      else if ((gVar1 == GGML_TYPE_F16) && (pgVar24->type == GGML_TYPE_F16)) {
        cVar14 = ggml_is_contiguous_1(pgVar25);
        if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar24), cVar14 != '\0')) &&
           (cVar14 = ggml_are_same_shape(pgVar25,pgVar24), cVar14 != '\0')) {
          if (pgVar24->nb[0] == 2) {
            if (pgVar25->nb[0] == 2) {
              lVar22 = pgVar25->ne[1];
              lVar19 = pgVar25->ne[2];
              sVar5 = pgVar25->nb[1];
              sVar6 = pgVar25->nb[2];
              sVar7 = pgVar25->nb[3];
              lVar8 = pgVar24->ne[0];
              gVar1 = dst->type;
              iVar2 = *(int *)&dst->field_0x4;
              lVar17 = ggml_nrows(pgVar25);
              lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
              lVar30 = (int)gVar1 * lVar18;
              lVar18 = lVar18 + lVar30;
              if (lVar17 <= lVar18) {
                lVar18 = lVar17;
              }
              if (lVar18 <= lVar30) {
                return;
              }
              lVar19 = lVar19 * lVar22;
              do {
                lVar17 = lVar30 % lVar19;
                if (0 < lVar8) {
                  pvVar9 = pgVar25->data;
                  lVar32 = 0;
                  do {
                    auVar40._0_4_ =
                         cosf(*(float *)(&ggml_table_f32_f16 +
                                        (ulong)*(ushort *)
                                                ((long)pvVar9 +
                                                lVar32 * 2 +
                                                (lVar17 / lVar22) * sVar6 +
                                                (lVar17 % lVar22) * sVar5 +
                                                (lVar30 / lVar19) * sVar7) * 4));
                    auVar40._4_60_ = extraout_var_00;
                    auVar36 = vcvtps2ph_f16c(auVar40._0_16_,0);
                    vpextrw_avx(auVar36,0);
                    lVar32 = lVar32 + 1;
                  } while (lVar8 != lVar32);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 != lVar18);
              return;
            }
            goto LAB_00130985;
          }
          goto LAB_00130969;
        }
      }
      else if (gVar1 == GGML_TYPE_BF16) {
        gVar4 = pgVar24->type;
        in_RCX = (ulong)gVar4;
        if (gVar4 == GGML_TYPE_F32) {
          cVar14 = ggml_is_contiguous_1(pgVar25);
          if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar24), cVar14 != '\0')) &&
             (cVar14 = ggml_are_same_shape(pgVar25,pgVar24), cVar14 != '\0')) {
            if (pgVar24->nb[0] == 4) {
              if (pgVar25->nb[0] == 2) {
                lVar22 = pgVar25->ne[1];
                lVar19 = pgVar25->ne[2];
                sVar5 = pgVar25->nb[1];
                sVar6 = pgVar25->nb[2];
                sVar7 = pgVar25->nb[3];
                lVar8 = pgVar24->ne[0];
                sVar10 = pgVar24->nb[1];
                sVar11 = pgVar24->nb[2];
                sVar12 = pgVar24->nb[3];
                gVar1 = dst->type;
                iVar2 = *(int *)&dst->field_0x4;
                lVar17 = ggml_nrows(pgVar25);
                lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                lVar30 = (int)gVar1 * lVar18;
                lVar18 = lVar18 + lVar30;
                if (lVar17 <= lVar18) {
                  lVar18 = lVar17;
                }
                if (lVar18 <= lVar30) {
                  return;
                }
                lVar19 = lVar19 * lVar22;
                do {
                  lVar17 = lVar30 / lVar19;
                  lVar21 = lVar30 % lVar19;
                  lVar32 = lVar21 / lVar22;
                  lVar21 = lVar21 % lVar22;
                  if (0 < lVar8) {
                    pvVar9 = pgVar24->data;
                    pvVar13 = pgVar25->data;
                    lVar31 = 0;
                    do {
                      fVar35 = cosf((float)((uint)*(ushort *)
                                                   ((long)pvVar13 +
                                                   lVar31 * 2 +
                                                   lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7)
                                           << 0x10));
                      *(float *)((long)pvVar9 +
                                lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                           fVar35;
                      lVar31 = lVar31 + 1;
                    } while (lVar8 != lVar31);
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar30 != lVar18);
                return;
              }
              goto LAB_00130985;
            }
            goto LAB_00130969;
          }
        }
        else {
          if (gVar4 != GGML_TYPE_BF16) goto LAB_001304be;
          cVar14 = ggml_is_contiguous_1(pgVar25);
          if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar24), cVar14 != '\0')) &&
             (cVar14 = ggml_are_same_shape(pgVar25,pgVar24), cVar14 != '\0')) {
            if (pgVar24->nb[0] == 2) {
              if (pgVar25->nb[0] == 2) {
                lVar22 = pgVar25->ne[1];
                lVar19 = pgVar25->ne[2];
                sVar5 = pgVar25->nb[1];
                sVar6 = pgVar25->nb[2];
                sVar7 = pgVar25->nb[3];
                lVar8 = pgVar24->ne[0];
                sVar10 = pgVar24->nb[1];
                sVar11 = pgVar24->nb[2];
                sVar12 = pgVar24->nb[3];
                gVar1 = dst->type;
                iVar2 = *(int *)&dst->field_0x4;
                lVar17 = ggml_nrows(pgVar25);
                lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                lVar30 = (int)gVar1 * lVar18;
                lVar18 = lVar18 + lVar30;
                if (lVar17 <= lVar18) {
                  lVar18 = lVar17;
                }
                if (lVar18 <= lVar30) {
                  return;
                }
                lVar19 = lVar19 * lVar22;
                do {
                  lVar17 = lVar30 / lVar19;
                  lVar21 = lVar30 % lVar19;
                  lVar32 = lVar21 / lVar22;
                  lVar21 = lVar21 % lVar22;
                  if (0 < lVar8) {
                    pvVar9 = pgVar24->data;
                    pvVar13 = pgVar25->data;
                    lVar31 = 0;
                    do {
                      fVar35 = cosf((float)((uint)*(ushort *)
                                                   ((long)pvVar13 +
                                                   lVar31 * 2 +
                                                   lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7)
                                           << 0x10));
                      if ((uint)ABS(fVar35) < 0x7f800001) {
                        uVar15 = (ushort)((int)fVar35 + 0x7fff + ((uint)fVar35 >> 0x10 & 1) >> 0x10)
                        ;
                      }
                      else {
                        uVar15 = (ushort)((uint)fVar35 >> 0x10) | 0x40;
                      }
                      *(ushort *)
                       ((long)pvVar9 +
                       lVar31 * 2 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) = uVar15;
                      lVar31 = lVar31 + 1;
                    } while (lVar8 != lVar31);
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar30 != lVar18);
                return;
              }
              goto LAB_00130985;
            }
            goto LAB_00130969;
          }
        }
      }
      else {
LAB_001304be:
        if ((gVar1 != GGML_TYPE_F16) || (pgVar24->type != GGML_TYPE_F32)) {
          ggml_compute_forward_cos_cold_1();
          pgVar26 = pgVar25->src[0];
          gVar1 = pgVar26->type;
          if ((gVar1 == GGML_TYPE_F32) && (pgVar25->type == GGML_TYPE_F32)) {
            cVar14 = ggml_is_contiguous_1(pgVar26);
            if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar25), cVar14 != '\0')) &&
               (cVar14 = ggml_are_same_shape(pgVar26,pgVar25), cVar14 != '\0')) {
              if (pgVar25->nb[0] != 4) goto LAB_001311f5;
              if (pgVar26->nb[0] == 4) {
                lVar22 = pgVar26->ne[1];
                lVar19 = pgVar26->ne[2];
                sVar5 = pgVar26->nb[1];
                sVar6 = pgVar26->nb[2];
                sVar7 = pgVar26->nb[3];
                lVar8 = pgVar25->ne[0];
                sVar10 = pgVar25->nb[1];
                sVar11 = pgVar25->nb[2];
                sVar12 = pgVar25->nb[3];
                gVar1 = pgVar24->type;
                iVar2 = *(int *)&pgVar24->field_0x4;
                lVar17 = ggml_nrows(pgVar26);
                lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                lVar30 = (int)gVar1 * lVar18;
                lVar18 = lVar18 + lVar30;
                if (lVar17 <= lVar18) {
                  lVar18 = lVar17;
                }
                if (lVar18 <= lVar30) {
                  return;
                }
                lVar19 = lVar19 * lVar22;
                do {
                  lVar17 = lVar30 / lVar19;
                  lVar21 = lVar30 % lVar19;
                  lVar32 = lVar21 / lVar22;
                  lVar21 = lVar21 % lVar22;
                  if (0 < lVar8) {
                    pvVar9 = pgVar25->data;
                    pvVar13 = pgVar26->data;
                    lVar31 = 0;
                    do {
                      fVar35 = logf(*(float *)((long)pvVar13 +
                                              lVar31 * 4 +
                                              lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7));
                      *(float *)((long)pvVar9 +
                                lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                           fVar35;
                      lVar31 = lVar31 + 1;
                    } while (lVar8 != lVar31);
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar30 != lVar18);
                return;
              }
LAB_00131211:
              pcVar20 = "nb00 == sizeof(src0_t)";
              uVar23 = 0x56;
              goto LAB_0013122b;
            }
          }
          else if ((gVar1 == GGML_TYPE_F16) && (pgVar25->type == GGML_TYPE_F16)) {
            cVar14 = ggml_is_contiguous_1(pgVar26);
            if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar25), cVar14 != '\0')) &&
               (cVar14 = ggml_are_same_shape(pgVar26,pgVar25), cVar14 != '\0')) {
              if (pgVar25->nb[0] == 2) {
                if (pgVar26->nb[0] == 2) {
                  lVar22 = pgVar26->ne[1];
                  lVar19 = pgVar26->ne[2];
                  sVar5 = pgVar26->nb[1];
                  sVar6 = pgVar26->nb[2];
                  sVar7 = pgVar26->nb[3];
                  lVar8 = pgVar25->ne[0];
                  gVar1 = pgVar24->type;
                  iVar2 = *(int *)&pgVar24->field_0x4;
                  lVar17 = ggml_nrows(pgVar26);
                  lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                  lVar30 = (int)gVar1 * lVar18;
                  lVar18 = lVar18 + lVar30;
                  if (lVar17 <= lVar18) {
                    lVar18 = lVar17;
                  }
                  if (lVar18 <= lVar30) {
                    return;
                  }
                  lVar19 = lVar19 * lVar22;
                  do {
                    lVar17 = lVar30 % lVar19;
                    if (0 < lVar8) {
                      pvVar9 = pgVar26->data;
                      lVar32 = 0;
                      do {
                        auVar41._0_4_ =
                             logf(*(float *)(&ggml_table_f32_f16 +
                                            (ulong)*(ushort *)
                                                    ((long)pvVar9 +
                                                    lVar32 * 2 +
                                                    (lVar17 / lVar22) * sVar6 +
                                                    (lVar17 % lVar22) * sVar5 +
                                                    (lVar30 / lVar19) * sVar7) * 4));
                        auVar41._4_60_ = extraout_var_01;
                        auVar36 = vcvtps2ph_f16c(auVar41._0_16_,0);
                        vpextrw_avx(auVar36,0);
                        lVar32 = lVar32 + 1;
                      } while (lVar8 != lVar32);
                    }
                    lVar30 = lVar30 + 1;
                  } while (lVar30 != lVar18);
                  return;
                }
                goto LAB_00131211;
              }
              goto LAB_001311f5;
            }
          }
          else if (gVar1 == GGML_TYPE_BF16) {
            gVar4 = pgVar25->type;
            in_RCX = (ulong)gVar4;
            if (gVar4 == GGML_TYPE_F32) {
              cVar14 = ggml_is_contiguous_1(pgVar26);
              if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar25), cVar14 != '\0')) &&
                 (cVar14 = ggml_are_same_shape(pgVar26,pgVar25), cVar14 != '\0')) {
                if (pgVar25->nb[0] == 4) {
                  if (pgVar26->nb[0] == 2) {
                    lVar22 = pgVar26->ne[1];
                    lVar19 = pgVar26->ne[2];
                    sVar5 = pgVar26->nb[1];
                    sVar6 = pgVar26->nb[2];
                    sVar7 = pgVar26->nb[3];
                    lVar8 = pgVar25->ne[0];
                    sVar10 = pgVar25->nb[1];
                    sVar11 = pgVar25->nb[2];
                    sVar12 = pgVar25->nb[3];
                    gVar1 = pgVar24->type;
                    iVar2 = *(int *)&pgVar24->field_0x4;
                    lVar17 = ggml_nrows(pgVar26);
                    lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                    lVar30 = (int)gVar1 * lVar18;
                    lVar18 = lVar18 + lVar30;
                    if (lVar17 <= lVar18) {
                      lVar18 = lVar17;
                    }
                    if (lVar18 <= lVar30) {
                      return;
                    }
                    lVar19 = lVar19 * lVar22;
                    do {
                      lVar17 = lVar30 / lVar19;
                      lVar21 = lVar30 % lVar19;
                      lVar32 = lVar21 / lVar22;
                      lVar21 = lVar21 % lVar22;
                      if (0 < lVar8) {
                        pvVar9 = pgVar25->data;
                        pvVar13 = pgVar26->data;
                        lVar31 = 0;
                        do {
                          fVar35 = logf((float)((uint)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar31 * 2 +
                                                       lVar32 * sVar6 +
                                                       lVar21 * sVar5 + lVar17 * sVar7) << 0x10));
                          *(float *)((long)pvVar9 +
                                    lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12
                                    ) = fVar35;
                          lVar31 = lVar31 + 1;
                        } while (lVar8 != lVar31);
                      }
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != lVar18);
                    return;
                  }
                  goto LAB_00131211;
                }
                goto LAB_001311f5;
              }
            }
            else {
              if (gVar4 != GGML_TYPE_BF16) goto LAB_00130d4a;
              cVar14 = ggml_is_contiguous_1(pgVar26);
              if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar25), cVar14 != '\0')) &&
                 (cVar14 = ggml_are_same_shape(pgVar26,pgVar25), cVar14 != '\0')) {
                if (pgVar25->nb[0] == 2) {
                  if (pgVar26->nb[0] == 2) {
                    lVar22 = pgVar26->ne[1];
                    lVar19 = pgVar26->ne[2];
                    sVar5 = pgVar26->nb[1];
                    sVar6 = pgVar26->nb[2];
                    sVar7 = pgVar26->nb[3];
                    lVar8 = pgVar25->ne[0];
                    sVar10 = pgVar25->nb[1];
                    sVar11 = pgVar25->nb[2];
                    sVar12 = pgVar25->nb[3];
                    gVar1 = pgVar24->type;
                    iVar2 = *(int *)&pgVar24->field_0x4;
                    lVar17 = ggml_nrows(pgVar26);
                    lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                    lVar30 = (int)gVar1 * lVar18;
                    lVar18 = lVar18 + lVar30;
                    if (lVar17 <= lVar18) {
                      lVar18 = lVar17;
                    }
                    if (lVar18 <= lVar30) {
                      return;
                    }
                    lVar19 = lVar19 * lVar22;
                    do {
                      lVar17 = lVar30 / lVar19;
                      lVar21 = lVar30 % lVar19;
                      lVar32 = lVar21 / lVar22;
                      lVar21 = lVar21 % lVar22;
                      if (0 < lVar8) {
                        pvVar9 = pgVar25->data;
                        pvVar13 = pgVar26->data;
                        lVar31 = 0;
                        do {
                          fVar35 = logf((float)((uint)*(ushort *)
                                                       ((long)pvVar13 +
                                                       lVar31 * 2 +
                                                       lVar32 * sVar6 +
                                                       lVar21 * sVar5 + lVar17 * sVar7) << 0x10));
                          if ((uint)ABS(fVar35) < 0x7f800001) {
                            uVar15 = (ushort)((int)fVar35 + 0x7fff + ((uint)fVar35 >> 0x10 & 1) >>
                                             0x10);
                          }
                          else {
                            uVar15 = (ushort)((uint)fVar35 >> 0x10) | 0x40;
                          }
                          *(ushort *)
                           ((long)pvVar9 +
                           lVar31 * 2 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                               uVar15;
                          lVar31 = lVar31 + 1;
                        } while (lVar8 != lVar31);
                      }
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != lVar18);
                    return;
                  }
                  goto LAB_00131211;
                }
                goto LAB_001311f5;
              }
            }
          }
          else {
LAB_00130d4a:
            if ((gVar1 != GGML_TYPE_F16) || (pgVar25->type != GGML_TYPE_F32)) {
              pgVar24 = pgVar25;
              ggml_compute_forward_log_cold_1();
              pgStack_1b0 = pgVar25;
              uVar27 = (uint)pgVar24;
              uVar16 = uVar27 & 0xffffffc0;
              uStack_240 = 0;
              uStack_238 = 0;
              uStack_230 = 0;
              uStack_228 = 0;
              uStack_220 = 0;
              uStack_218 = 0;
              uStack_210 = 0;
              uStack_208 = 0;
              uStack_280 = 0;
              uStack_278 = 0;
              uStack_270 = 0;
              uStack_268 = 0;
              uStack_260 = 0;
              uStack_258 = 0;
              uStack_250 = 0;
              uStack_248 = 0;
              uStack_2c0 = 0;
              uStack_2b8 = 0;
              uStack_2b0 = 0;
              uStack_2a8 = 0;
              uStack_2a0 = 0;
              uStack_298 = 0;
              uStack_290 = 0;
              uStack_288 = 0;
              auStack_300 = ZEXT1664(ZEXT816(0));
              if (0 < (int)uVar16) {
                uVar28 = 0;
                lVar22 = in_R9;
                uVar29 = in_RCX;
                do {
                  lVar19 = 0;
                  do {
                    auVar34 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(lVar22 + lVar19),
                                                  *(undefined1 (*) [64])(uVar29 + lVar19),
                                                  *(undefined1 (*) [64])(auStack_300 + lVar19));
                    *(undefined1 (*) [64])(auStack_300 + lVar19) = auVar34;
                    lVar19 = lVar19 + 0x40;
                  } while (lVar19 != 0x100);
                  uVar28 = uVar28 + 0x40;
                  lVar22 = lVar22 + 0x100;
                  uVar29 = uVar29 + 0x100;
                } while (uVar28 < uVar16);
              }
              lVar22 = 0;
              do {
                auVar34 = vaddps_avx512f(*(undefined1 (*) [64])(auStack_300 + lVar22),
                                         *(undefined1 (*) [64])((long)&uStack_280 + lVar22));
                *(undefined1 (*) [64])(auStack_300 + lVar22) = auVar34;
                lVar22 = lVar22 + 0x40;
              } while (lVar22 == 0x40);
              auVar34._8_8_ = uStack_2b8;
              auVar34._0_8_ = uStack_2c0;
              auVar34._16_8_ = uStack_2b0;
              auVar34._24_8_ = uStack_2a8;
              auVar34._32_8_ = uStack_2a0;
              auVar34._40_8_ = uStack_298;
              auVar34._48_8_ = uStack_290;
              auVar34._56_8_ = uStack_288;
              auVar34 = vaddps_avx512f(auStack_300,auVar34);
              auVar33 = vextractf64x4_avx512f(auVar34,1);
              auVar34 = vaddps_avx512f(auVar34,ZEXT3264(auVar33));
              auVar37._0_4_ = auVar34._0_4_ + auVar34._16_4_;
              auVar37._4_4_ = auVar34._4_4_ + auVar34._20_4_;
              auVar37._8_4_ = auVar34._8_4_ + auVar34._24_4_;
              auVar37._12_4_ = auVar34._12_4_ + auVar34._28_4_;
              auVar36 = vshufpd_avx(auVar37,auVar37,1);
              auVar38._0_4_ = auVar37._0_4_ + auVar36._0_4_;
              auVar38._4_4_ = auVar37._4_4_ + auVar36._4_4_;
              auVar38._8_4_ = auVar37._8_4_ + auVar36._8_4_;
              auVar38._12_4_ = auVar37._12_4_ + auVar36._12_4_;
              auVar36 = vhaddps_avx(auVar38,auVar38);
              auVar34 = ZEXT1664(auVar36);
              if (uVar16 != uVar27) {
                lVar22 = (long)(int)uVar16;
                do {
                  auVar36 = vfmadd231ss_fma(auVar34._0_16_,ZEXT416(*(uint *)(in_RCX + lVar22 * 4)),
                                            ZEXT416(*(uint *)(in_R9 + lVar22 * 4)));
                  auVar34 = ZEXT1664(auVar36);
                  lVar22 = lVar22 + 1;
                } while (lVar22 < (int)uVar27);
              }
              pgVar26->type = auVar34._0_4_;
              return;
            }
            cVar14 = ggml_is_contiguous_1(pgVar26);
            if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar25), cVar14 != '\0')) &&
               (cVar14 = ggml_are_same_shape(pgVar26,pgVar25), cVar14 != '\0')) {
              if (pgVar25->nb[0] == 4) {
                if (pgVar26->nb[0] == 2) {
                  lVar22 = pgVar26->ne[1];
                  lVar19 = pgVar26->ne[2];
                  sVar5 = pgVar26->nb[1];
                  sVar6 = pgVar26->nb[2];
                  sVar7 = pgVar26->nb[3];
                  lVar8 = pgVar25->ne[0];
                  sVar10 = pgVar25->nb[1];
                  sVar11 = pgVar25->nb[2];
                  sVar12 = pgVar25->nb[3];
                  gVar1 = pgVar24->type;
                  iVar2 = *(int *)&pgVar24->field_0x4;
                  lVar17 = ggml_nrows(pgVar26);
                  lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
                  lVar30 = (int)gVar1 * lVar18;
                  lVar18 = lVar18 + lVar30;
                  if (lVar17 <= lVar18) {
                    lVar18 = lVar17;
                  }
                  if (lVar30 < lVar18) {
                    lVar19 = lVar19 * lVar22;
                    do {
                      lVar17 = lVar30 / lVar19;
                      lVar21 = lVar30 % lVar19;
                      lVar32 = lVar21 / lVar22;
                      lVar21 = lVar21 % lVar22;
                      if (0 < lVar8) {
                        pvVar9 = pgVar25->data;
                        pvVar13 = pgVar26->data;
                        lVar31 = 0;
                        do {
                          fVar35 = logf(*(float *)(&ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pvVar13 +
                                                          lVar31 * 2 +
                                                          lVar32 * sVar6 +
                                                          lVar21 * sVar5 + lVar17 * sVar7) * 4));
                          *(float *)((long)pvVar9 +
                                    lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12
                                    ) = fVar35;
                          lVar31 = lVar31 + 1;
                        } while (lVar8 != lVar31);
                      }
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != lVar18);
                  }
                  return;
                }
                goto LAB_00131211;
              }
LAB_001311f5:
              pcVar20 = "nb0 == sizeof(dst_t)";
              uVar23 = 0x55;
              goto LAB_0013122b;
            }
          }
          pcVar20 = 
          "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)"
          ;
          uVar23 = 0x51;
LAB_0013122b:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                     ,uVar23,"GGML_ASSERT(%s) failed",pcVar20);
        }
        cVar14 = ggml_is_contiguous_1(pgVar25);
        if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(pgVar24), cVar14 != '\0')) &&
           (cVar14 = ggml_are_same_shape(pgVar25,pgVar24), cVar14 != '\0')) {
          if (pgVar24->nb[0] == 4) {
            if (pgVar25->nb[0] == 2) {
              lVar22 = pgVar25->ne[1];
              lVar19 = pgVar25->ne[2];
              sVar5 = pgVar25->nb[1];
              sVar6 = pgVar25->nb[2];
              sVar7 = pgVar25->nb[3];
              lVar8 = pgVar24->ne[0];
              sVar10 = pgVar24->nb[1];
              sVar11 = pgVar24->nb[2];
              sVar12 = pgVar24->nb[3];
              gVar1 = dst->type;
              iVar2 = *(int *)&dst->field_0x4;
              lVar17 = ggml_nrows(pgVar25);
              lVar18 = ((long)iVar2 + -1 + lVar17) / (long)iVar2;
              lVar30 = (int)gVar1 * lVar18;
              lVar18 = lVar18 + lVar30;
              if (lVar17 <= lVar18) {
                lVar18 = lVar17;
              }
              if (lVar30 < lVar18) {
                lVar19 = lVar19 * lVar22;
                do {
                  lVar17 = lVar30 / lVar19;
                  lVar21 = lVar30 % lVar19;
                  lVar32 = lVar21 / lVar22;
                  lVar21 = lVar21 % lVar22;
                  if (0 < lVar8) {
                    pvVar9 = pgVar24->data;
                    pvVar13 = pgVar25->data;
                    lVar31 = 0;
                    do {
                      fVar35 = cosf(*(float *)(&ggml_table_f32_f16 +
                                              (ulong)*(ushort *)
                                                      ((long)pvVar13 +
                                                      lVar31 * 2 +
                                                      lVar32 * sVar6 +
                                                      lVar21 * sVar5 + lVar17 * sVar7) * 4));
                      *(float *)((long)pvVar9 +
                                lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                           fVar35;
                      lVar31 = lVar31 + 1;
                    } while (lVar8 != lVar31);
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar30 != lVar18);
              }
              return;
            }
            goto LAB_00130985;
          }
LAB_00130969:
          pcVar20 = "nb0 == sizeof(dst_t)";
          uVar23 = 0x55;
          goto LAB_0013099f;
        }
      }
      pcVar20 = 
      "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
      uVar23 = 0x51;
LAB_0013099f:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,uVar23,"GGML_ASSERT(%s) failed",pcVar20);
    }
    cVar14 = ggml_is_contiguous_1(pgVar24);
    if (((cVar14 != '\0') && (cVar14 = ggml_is_contiguous_1(dst), cVar14 != '\0')) &&
       (cVar14 = ggml_are_same_shape(pgVar24,dst), cVar14 != '\0')) {
      if (dst->nb[0] == 4) {
        if (pgVar24->nb[0] == 2) {
          lVar22 = pgVar24->ne[1];
          lVar19 = pgVar24->ne[2];
          sVar5 = pgVar24->nb[1];
          sVar6 = pgVar24->nb[2];
          sVar7 = pgVar24->nb[3];
          lVar8 = dst->ne[0];
          sVar10 = dst->nb[1];
          sVar11 = dst->nb[2];
          sVar12 = dst->nb[3];
          iVar2 = params->ith;
          iVar3 = params->nth;
          lVar17 = ggml_nrows(pgVar24);
          lVar18 = ((long)iVar3 + -1 + lVar17) / (long)iVar3;
          lVar30 = iVar2 * lVar18;
          lVar18 = lVar18 + lVar30;
          if (lVar17 <= lVar18) {
            lVar18 = lVar17;
          }
          if (lVar30 < lVar18) {
            lVar19 = lVar19 * lVar22;
            do {
              lVar17 = lVar30 / lVar19;
              lVar21 = lVar30 % lVar19;
              lVar32 = lVar21 / lVar22;
              lVar21 = lVar21 % lVar22;
              if (0 < lVar8) {
                pvVar9 = dst->data;
                pvVar13 = pgVar24->data;
                lVar31 = 0;
                do {
                  fVar35 = sinf(*(float *)(&ggml_table_f32_f16 +
                                          (ulong)*(ushort *)
                                                  ((long)pvVar13 +
                                                  lVar31 * 2 +
                                                  lVar32 * sVar6 + lVar21 * sVar5 + lVar17 * sVar7)
                                          * 4));
                  *(float *)((long)pvVar9 +
                            lVar31 * 4 + lVar32 * sVar11 + lVar21 * sVar10 + lVar17 * sVar12) =
                       fVar35;
                  lVar31 = lVar31 + 1;
                } while (lVar8 != lVar31);
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != lVar18);
          }
          return;
        }
        goto LAB_001300f9;
      }
LAB_001300dd:
      pcVar20 = "nb0 == sizeof(dst_t)";
      uVar23 = 0x55;
      goto LAB_00130113;
    }
  }
  pcVar20 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar23 = 0x51;
LAB_00130113:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar23,"GGML_ASSERT(%s) failed",pcVar20);
}

Assistant:

void ggml_compute_forward_sin(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_sin>(params, dst);
}